

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::BVHNIntersector1<4,_16781328,_false,_embree::avx2::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  char cVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vint4 ai_1;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  vint4 ai_3;
  undefined1 auVar28 [16];
  undefined4 uVar29;
  vint4 ai;
  undefined1 auVar30 [16];
  vint4 ai_2;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  vint4 ai_4;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vfloat4 a0;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 bi_2;
  vint4 bi;
  Precalculations pre;
  NodeRef stack [244];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      aVar6 = (ray->dir).field_0.field_1;
      auVar31 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
      auVar25 = vrsqrtss_avx(auVar31,auVar31);
      fVar39 = auVar25._0_4_;
      local_818[0] = fVar39 * 1.5 - auVar31._0_4_ * 0.5 * fVar39 * fVar39 * fVar39;
      uVar2 = *(undefined4 *)&(ray->dir).field_0;
      auVar45._0_4_ = aVar6.x * local_818[0];
      auVar45._4_4_ = aVar6.y * local_818[0];
      auVar45._8_4_ = aVar6.z * local_818[0];
      auVar45._12_4_ = aVar6.field_3.w * local_818[0];
      auVar25 = vshufpd_avx(auVar45,auVar45,1);
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar31 = vmovshdup_avx(auVar45);
      auVar56._0_4_ = auVar31._0_4_ ^ 0x80000000;
      auVar41 = ZEXT816(0) << 0x40;
      auVar31 = vunpckhps_avx(auVar45,auVar41);
      auVar56._4_12_ = ZEXT812(0) << 0x20;
      auVar40 = vshufps_avx(auVar31,auVar56,0x41);
      auVar52._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      auVar52._8_8_ = auVar25._8_8_ ^ auVar24._8_8_;
      auVar24 = vinsertps_avx(auVar52,auVar45,0x2a);
      auVar31 = vdpps_avx(auVar40,auVar40,0x7f);
      auVar25 = vdpps_avx(auVar24,auVar24,0x7f);
      auVar31 = vcmpps_avx(auVar25,auVar31,1);
      auVar57._0_4_ = auVar31._0_4_;
      auVar57._4_4_ = auVar57._0_4_;
      auVar57._8_4_ = auVar57._0_4_;
      auVar57._12_4_ = auVar57._0_4_;
      auVar31 = vblendvps_avx(auVar24,auVar40,auVar57);
      auVar25 = vdpps_avx(auVar31,auVar31,0x7f);
      uVar3 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar24 = vrsqrtss_avx(auVar25,auVar25);
      fVar27 = auVar24._0_4_;
      fVar39 = (ray->dir).field_0.m128[2];
      fVar27 = fVar27 * 1.5 - auVar25._0_4_ * 0.5 * fVar27 * fVar27 * fVar27;
      auVar53._0_4_ = auVar31._0_4_ * fVar27;
      auVar53._4_4_ = auVar31._4_4_ * fVar27;
      auVar53._8_4_ = auVar31._8_4_ * fVar27;
      auVar53._12_4_ = auVar31._12_4_ * fVar27;
      auVar31 = vshufps_avx(auVar53,auVar53,0xc9);
      auVar25 = vshufps_avx(auVar45,auVar45,0xc9);
      auVar55._0_4_ = auVar53._0_4_ * auVar25._0_4_;
      auVar55._4_4_ = auVar53._4_4_ * auVar25._4_4_;
      auVar55._8_4_ = auVar53._8_4_ * auVar25._8_4_;
      auVar55._12_4_ = auVar53._12_4_ * auVar25._12_4_;
      auVar31 = vfmsub231ps_fma(auVar55,auVar45,auVar31);
      auVar24 = vshufps_avx(auVar31,auVar31,0xc9);
      auVar31 = vdpps_avx(auVar24,auVar24,0x7f);
      auVar25 = vrsqrtss_avx(auVar31,auVar31);
      fVar27 = auVar25._0_4_;
      fVar27 = fVar27 * 1.5 - fVar27 * fVar27 * fVar27 * auVar31._0_4_ * 0.5;
      auVar25._0_4_ = auVar24._0_4_ * fVar27;
      auVar25._4_4_ = auVar24._4_4_ * fVar27;
      auVar25._8_4_ = auVar24._8_4_ * fVar27;
      auVar25._12_4_ = auVar24._12_4_ * fVar27;
      auVar31._0_4_ = local_818[0] * auVar45._0_4_;
      auVar31._4_4_ = local_818[0] * auVar45._4_4_;
      auVar31._8_4_ = local_818[0] * auVar45._8_4_;
      auVar31._12_4_ = local_818[0] * auVar45._12_4_;
      auVar24 = vunpcklps_avx(auVar53,auVar31);
      auVar31 = vunpckhps_avx(auVar53,auVar31);
      auVar40 = vunpcklps_avx(auVar25,auVar41);
      auVar25 = vunpckhps_avx(auVar25,auVar41);
      local_7e8 = vunpcklps_avx(auVar31,auVar25);
      local_808 = vunpcklps_avx(auVar24,auVar40);
      local_7f8 = vunpckhps_avx(auVar24,auVar40);
      auVar25 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      puVar19 = local_7d0;
      auVar32._8_4_ = 0x7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar32._12_4_ = 0x7fffffff;
      auVar31 = vandps_avx((undefined1  [16])aVar6,auVar32);
      auVar40._8_4_ = 0x219392ef;
      auVar40._0_8_ = 0x219392ef219392ef;
      auVar40._12_4_ = 0x219392ef;
      auVar31 = vcmpps_avx(auVar31,auVar40,1);
      auVar31 = vblendvps_avx((undefined1  [16])aVar6,auVar40,auVar31);
      auVar24 = vrcpps_avx(auVar31);
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar31 = vfnmadd213ps_fma(auVar31,auVar24,auVar41);
      auVar41 = vfmadd132ps_fma(auVar31,auVar24,auVar24);
      fVar27 = auVar41._0_4_;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      auVar31 = vmovshdup_avx(auVar41);
      auVar24 = vshufpd_avx(auVar41,auVar41,1);
      auVar46._0_4_ = fVar27 * (ray->org).field_0.m128[0];
      auVar46._4_4_ = auVar41._4_4_ * (ray->org).field_0.m128[1];
      auVar46._8_4_ = auVar41._8_4_ * (ray->org).field_0.m128[2];
      auVar46._12_4_ = auVar41._12_4_ * (ray->org).field_0.m128[3];
      uVar21 = (ulong)(fVar27 < 0.0) * 0x10;
      uVar18 = (ulong)(auVar31._0_4_ < 0.0) << 4 | 0x20;
      auVar50._4_4_ = fVar27;
      auVar50._0_4_ = fVar27;
      auVar50._8_4_ = fVar27;
      auVar50._12_4_ = fVar27;
      auVar31 = vshufps_avx(auVar46,auVar46,0x55);
      auVar40 = vshufps_avx(auVar46,auVar46,0xaa);
      uVar20 = CONCAT44(auVar46._0_4_,auVar46._0_4_);
      auVar47._0_8_ = uVar20 ^ 0x8000000080000000;
      auVar47._8_4_ = -auVar46._0_4_;
      auVar47._12_4_ = -auVar46._0_4_;
      auVar54._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
      auVar54._8_4_ = auVar31._8_4_ ^ 0x80000000;
      auVar54._12_4_ = auVar31._12_4_ ^ 0x80000000;
      auVar42._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      auVar42._8_4_ = auVar40._8_4_ ^ 0x80000000;
      auVar42._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar31 = vshufps_avx(auVar41,auVar41,0x55);
      auVar40 = vshufps_avx(auVar41,auVar41,0xaa);
      uVar20 = (ulong)(auVar24._0_4_ < 0.0) << 4 | 0x40;
      uVar29 = auVar25._0_4_;
      auVar59._4_4_ = uVar29;
      auVar59._0_4_ = uVar29;
      auVar59._8_4_ = uVar29;
      auVar59._12_4_ = uVar29;
      auVar61._4_4_ = fVar1;
      auVar61._0_4_ = fVar1;
      auVar61._8_4_ = fVar1;
      auVar61._12_4_ = fVar1;
      uVar29 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
LAB_0147a986:
      if (puVar19 != &local_7d8) {
        uVar15 = puVar19[-1];
        puVar19 = puVar19 + -1;
        do {
          fVar1 = (ray->dir).field_0.m128[3];
          auVar22._4_4_ = fVar1;
          auVar22._0_4_ = fVar1;
          auVar22._8_4_ = fVar1;
          auVar22._12_4_ = fVar1;
          fVar27 = 1.0 - fVar1;
          auVar23._4_4_ = fVar27;
          auVar23._0_4_ = fVar27;
          auVar23._8_4_ = fVar27;
          auVar23._12_4_ = fVar27;
          do {
            if ((uVar15 & 8) != 0) {
              cVar13 = (**(code **)((long)This->leafIntersector +
                                   (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40 + 8))
                                 (local_818,ray,context);
              if (cVar13 != '\0') {
                ray->tfar = -INFINITY;
                return;
              }
              goto LAB_0147a986;
            }
            uVar16 = (uint)uVar15 & 7;
            uVar14 = uVar15 & 0xfffffffffffffff0;
            if (uVar16 == 3) {
              auVar25 = *(undefined1 (*) [16])(uVar14 + 0x80);
              auVar24 = *(undefined1 (*) [16])(uVar14 + 0x90);
              auVar41 = *(undefined1 (*) [16])(uVar14 + 0xa0);
              auVar58._0_4_ = fVar39 * auVar25._0_4_;
              auVar58._4_4_ = fVar39 * auVar25._4_4_;
              auVar58._8_4_ = fVar39 * auVar25._8_4_;
              auVar58._12_4_ = fVar39 * auVar25._12_4_;
              auVar60._0_4_ = fVar39 * auVar24._0_4_;
              auVar60._4_4_ = fVar39 * auVar24._4_4_;
              auVar60._8_4_ = fVar39 * auVar24._8_4_;
              auVar60._12_4_ = fVar39 * auVar24._12_4_;
              auVar62._0_4_ = fVar39 * auVar41._0_4_;
              auVar62._4_4_ = fVar39 * auVar41._4_4_;
              auVar62._8_4_ = fVar39 * auVar41._8_4_;
              auVar62._12_4_ = fVar39 * auVar41._12_4_;
              auVar11._4_4_ = uVar3;
              auVar11._0_4_ = uVar3;
              auVar11._8_4_ = uVar3;
              auVar11._12_4_ = uVar3;
              auVar45 = vfmadd231ps_fma(auVar58,auVar11,*(undefined1 (*) [16])(uVar14 + 0x50));
              auVar46 = vfmadd231ps_fma(auVar60,auVar11,*(undefined1 (*) [16])(uVar14 + 0x60));
              auVar52 = vfmadd231ps_fma(auVar62,auVar11,*(undefined1 (*) [16])(uVar14 + 0x70));
              auVar12._4_4_ = uVar2;
              auVar12._0_4_ = uVar2;
              auVar12._8_4_ = uVar2;
              auVar12._12_4_ = uVar2;
              auVar53 = vfmadd231ps_fma(auVar45,auVar12,*(undefined1 (*) [16])(uVar14 + 0x20));
              auVar56 = vfmadd231ps_fma(auVar46,auVar12,*(undefined1 (*) [16])(uVar14 + 0x30));
              auVar57 = vfmadd231ps_fma(auVar52,auVar12,*(undefined1 (*) [16])(uVar14 + 0x40));
              auVar45 = vandps_avx(auVar53,auVar32);
              auVar33._8_4_ = 0x219392ef;
              auVar33._0_8_ = 0x219392ef219392ef;
              auVar33._12_4_ = 0x219392ef;
              auVar45 = vcmpps_avx(auVar45,auVar33,1);
              auVar46 = vblendvps_avx(auVar53,auVar33,auVar45);
              auVar45 = vandps_avx(auVar56,auVar32);
              auVar45 = vcmpps_avx(auVar45,auVar33,1);
              auVar52 = vblendvps_avx(auVar56,auVar33,auVar45);
              auVar45 = vandps_avx(auVar57,auVar32);
              auVar45 = vcmpps_avx(auVar45,auVar33,1);
              auVar45 = vblendvps_avx(auVar57,auVar33,auVar45);
              auVar53 = vrcpps_avx(auVar46);
              auVar34._8_4_ = 0x3f800000;
              auVar34._0_8_ = 0x3f8000003f800000;
              auVar34._12_4_ = 0x3f800000;
              auVar46 = vfnmadd213ps_fma(auVar46,auVar53,auVar34);
              auVar53 = vfmadd132ps_fma(auVar46,auVar53,auVar53);
              auVar46 = vrcpps_avx(auVar52);
              auVar52 = vfnmadd213ps_fma(auVar52,auVar46,auVar34);
              auVar56 = vfmadd132ps_fma(auVar52,auVar46,auVar46);
              auVar46 = vrcpps_avx(auVar45);
              auVar45 = vfnmadd213ps_fma(auVar45,auVar46,auVar34);
              auVar57 = vfmadd132ps_fma(auVar45,auVar46,auVar46);
              auVar8._4_4_ = uVar5;
              auVar8._0_4_ = uVar5;
              auVar8._8_4_ = uVar5;
              auVar8._12_4_ = uVar5;
              auVar25 = vfmadd213ps_fma(auVar25,auVar8,*(undefined1 (*) [16])(uVar14 + 0xb0));
              auVar9._4_4_ = uVar29;
              auVar9._0_4_ = uVar29;
              auVar9._8_4_ = uVar29;
              auVar9._12_4_ = uVar29;
              auVar45 = vfmadd231ps_fma(auVar25,auVar9,*(undefined1 (*) [16])(uVar14 + 0x50));
              auVar25 = vfmadd213ps_fma(auVar24,auVar8,*(undefined1 (*) [16])(uVar14 + 0xc0));
              auVar24 = vfmadd213ps_fma(auVar41,auVar8,*(undefined1 (*) [16])(uVar14 + 0xd0));
              auVar25 = vfmadd231ps_fma(auVar25,auVar9,*(undefined1 (*) [16])(uVar14 + 0x60));
              auVar24 = vfmadd231ps_fma(auVar24,auVar9,*(undefined1 (*) [16])(uVar14 + 0x70));
              auVar51._0_4_ = fVar1 * *(float *)(uVar14 + 0xe0);
              auVar51._4_4_ = fVar1 * *(float *)(uVar14 + 0xe4);
              auVar51._8_4_ = fVar1 * *(float *)(uVar14 + 0xe8);
              auVar51._12_4_ = fVar1 * *(float *)(uVar14 + 0xec);
              auVar10._4_4_ = uVar4;
              auVar10._0_4_ = uVar4;
              auVar10._8_4_ = uVar4;
              auVar10._12_4_ = uVar4;
              auVar41 = vfmadd231ps_fma(auVar45,auVar10,*(undefined1 (*) [16])(uVar14 + 0x20));
              auVar48._0_4_ = fVar1 * *(float *)(uVar14 + 0xf0);
              auVar48._4_4_ = fVar1 * *(float *)(uVar14 + 0xf4);
              auVar48._8_4_ = fVar1 * *(float *)(uVar14 + 0xf8);
              auVar48._12_4_ = fVar1 * *(float *)(uVar14 + 0xfc);
              auVar45 = vfmadd231ps_fma(auVar25,auVar10,*(undefined1 (*) [16])(uVar14 + 0x30));
              auVar43._0_4_ = fVar1 * *(float *)(uVar14 + 0x100);
              auVar43._4_4_ = fVar1 * *(float *)(uVar14 + 0x104);
              auVar43._8_4_ = fVar1 * *(float *)(uVar14 + 0x108);
              auVar43._12_4_ = fVar1 * *(float *)(uVar14 + 0x10c);
              auVar55 = ZEXT816(0) << 0x20;
              auVar25 = vfmadd231ps_fma(auVar51,auVar23,auVar55);
              auVar46 = vfmadd231ps_fma(auVar48,auVar23,auVar55);
              auVar52 = vfmadd231ps_fma(auVar24,auVar10,*(undefined1 (*) [16])(uVar14 + 0x40));
              auVar35._0_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 0x110);
              auVar35._4_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 0x114);
              auVar35._8_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 0x118);
              auVar35._12_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 0x11c);
              auVar25 = vsubps_avx(auVar25,auVar41);
              auVar24 = vsubps_avx(auVar35,auVar41);
              auVar55 = vfmadd231ps_fma(auVar43,auVar23,auVar55);
              auVar36._0_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 0x120);
              auVar36._4_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 0x124);
              auVar36._8_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 0x128);
              auVar36._12_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 300);
              auVar41 = vsubps_avx(auVar46,auVar45);
              auVar45 = vsubps_avx(auVar36,auVar45);
              auVar37._0_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 0x130);
              auVar37._4_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 0x134);
              auVar37._8_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 0x138);
              auVar37._12_4_ = fVar27 + fVar1 * *(float *)(uVar14 + 0x13c);
              auVar46 = vsubps_avx(auVar55,auVar52);
              auVar52 = vsubps_avx(auVar37,auVar52);
              auVar38._0_4_ = auVar25._0_4_ * auVar53._0_4_;
              auVar38._4_4_ = auVar25._4_4_ * auVar53._4_4_;
              auVar38._8_4_ = auVar25._8_4_ * auVar53._8_4_;
              auVar38._12_4_ = auVar25._12_4_ * auVar53._12_4_;
              auVar30._0_4_ = auVar53._0_4_ * auVar24._0_4_;
              auVar30._4_4_ = auVar53._4_4_ * auVar24._4_4_;
              auVar30._8_4_ = auVar53._8_4_ * auVar24._8_4_;
              auVar30._12_4_ = auVar53._12_4_ * auVar24._12_4_;
              auVar49._0_4_ = auVar56._0_4_ * auVar41._0_4_;
              auVar49._4_4_ = auVar56._4_4_ * auVar41._4_4_;
              auVar49._8_4_ = auVar56._8_4_ * auVar41._8_4_;
              auVar49._12_4_ = auVar56._12_4_ * auVar41._12_4_;
              auVar44._0_4_ = auVar57._0_4_ * auVar46._0_4_;
              auVar44._4_4_ = auVar57._4_4_ * auVar46._4_4_;
              auVar44._8_4_ = auVar57._8_4_ * auVar46._8_4_;
              auVar44._12_4_ = auVar57._12_4_ * auVar46._12_4_;
              auVar28._0_4_ = auVar56._0_4_ * auVar45._0_4_;
              auVar28._4_4_ = auVar56._4_4_ * auVar45._4_4_;
              auVar28._8_4_ = auVar56._8_4_ * auVar45._8_4_;
              auVar28._12_4_ = auVar56._12_4_ * auVar45._12_4_;
              auVar26._0_4_ = auVar57._0_4_ * auVar52._0_4_;
              auVar26._4_4_ = auVar57._4_4_ * auVar52._4_4_;
              auVar26._8_4_ = auVar57._8_4_ * auVar52._8_4_;
              auVar26._12_4_ = auVar57._12_4_ * auVar52._12_4_;
              auVar25 = vpminsd_avx(auVar49,auVar28);
              auVar24 = vpminsd_avx(auVar44,auVar26);
              auVar25 = vmaxps_avx(auVar25,auVar24);
              auVar46 = vpminsd_avx(auVar38,auVar30);
              auVar45 = vpmaxsd_avx(auVar38,auVar30);
              auVar24 = vpmaxsd_avx(auVar49,auVar28);
              auVar41 = vpmaxsd_avx(auVar44,auVar26);
              auVar41 = vminps_avx(auVar24,auVar41);
              auVar24 = vmaxps_avx(auVar59,auVar46);
              auVar25 = vmaxps_avx(auVar24,auVar25);
              auVar24 = vminps_avx(auVar61,auVar45);
              auVar24 = vminps_avx(auVar24,auVar41);
              auVar25 = vcmpps_avx(auVar25,auVar24,2);
            }
            else {
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar21),auVar22,
                                        *(undefined1 (*) [16])(uVar14 + 0x20 + uVar21));
              auVar25 = vfmadd213ps_fma(auVar25,auVar50,auVar47);
              auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar18),auVar22,
                                        *(undefined1 (*) [16])(uVar14 + 0x20 + uVar18));
              auVar24 = vfmadd213ps_fma(auVar24,auVar31,auVar54);
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar20),auVar22,
                                        *(undefined1 (*) [16])(uVar14 + 0x20 + uVar20));
              auVar25 = vpmaxsd_avx(auVar25,auVar24);
              auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + (uVar21 ^ 0x10)),
                                        auVar22,*(undefined1 (*) [16])
                                                 (uVar14 + 0x20 + (uVar21 ^ 0x10)));
              auVar45 = vfmadd213ps_fma(auVar41,auVar40,auVar42);
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + (uVar18 ^ 0x10)),
                                        auVar22,*(undefined1 (*) [16])
                                                 (uVar14 + 0x20 + (uVar18 ^ 0x10)));
              auVar24 = vfmadd213ps_fma(auVar24,auVar50,auVar47);
              auVar41 = vfmadd213ps_fma(auVar41,auVar31,auVar54);
              auVar41 = vpminsd_avx(auVar24,auVar41);
              auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + (uVar20 ^ 0x10)),
                                        auVar22,*(undefined1 (*) [16])
                                                 (uVar14 + 0x20 + (uVar20 ^ 0x10)));
              auVar46 = vfmadd213ps_fma(auVar24,auVar40,auVar42);
              auVar24 = vpmaxsd_avx(auVar45,auVar59);
              auVar25 = vpmaxsd_avx(auVar25,auVar24);
              auVar24 = vpminsd_avx(auVar46,auVar61);
              auVar24 = vpminsd_avx(auVar41,auVar24);
              auVar25 = vcmpps_avx(auVar25,auVar24,2);
              if (uVar16 == 6) {
                auVar24 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0xe0),auVar22,2);
                auVar41 = vcmpps_avx(auVar22,*(undefined1 (*) [16])(uVar14 + 0xf0),1);
                auVar24 = vandps_avx(auVar24,auVar41);
                auVar25 = vandps_avx(auVar24,auVar25);
              }
            }
            auVar25 = vpslld_avx(auVar25,0x1f);
            uVar16 = vmovmskps_avx(auVar25);
            if (uVar16 == 0) goto LAB_0147a986;
            uVar16 = uVar16 & 0xff;
            lVar7 = 0;
            for (uVar15 = (ulong)uVar16; (uVar15 & 1) == 0;
                uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar7 = lVar7 + 1;
            }
            uVar15 = *(ulong *)(uVar14 + lVar7 * 8);
            uVar16 = uVar16 - 1 & uVar16;
            uVar17 = (ulong)uVar16;
          } while (uVar16 == 0);
          do {
            *puVar19 = uVar15;
            puVar19 = puVar19 + 1;
            lVar7 = 0;
            for (uVar15 = uVar17; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar7 = lVar7 + 1;
            }
            uVar17 = uVar17 - 1 & uVar17;
            uVar15 = *(ulong *)(uVar14 + lVar7 * 8);
          } while (uVar17 != 0);
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }